

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::detail::AddArg<int>
               (string *result,const_iterator *it,const_iterator *itend,int *arg)

{
  bool bVar1;
  reference pcVar2;
  void *pvVar3;
  string local_1e8 [40];
  exception *anon_var_0;
  char local_1b5;
  char type;
  char local_1a1;
  ostringstream local_1a0 [7];
  char mod;
  ostringstream str;
  int *arg_local;
  const_iterator *itend_local;
  const_iterator *it_local;
  string *result_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a1 = 0;
  local_1a1 = Parse((ostream *)local_1a0,it,itend);
  bVar1 = __gnu_cxx::operator!=(it,itend);
  if (bVar1) {
    anon_var_0 = (exception *)
                 __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(it,0);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&anon_var_0);
    local_1b5 = *pcVar2;
    switch(local_1b5) {
    case 'A':
      pvVar3 = (void *)std::ostream::operator<<(local_1a0,std::hexfloat);
      std::ostream::operator<<(pvVar3,std::uppercase);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    default:
      std::operator<<((ostream *)local_1a0,local_1b5);
      break;
    case 'E':
      pvVar3 = (void *)std::ostream::operator<<(local_1a0,std::scientific);
      std::ostream::operator<<(pvVar3,std::uppercase);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'G':
      pvVar3 = (void *)std::ostream::operator<<(local_1a0,std::defaultfloat);
      std::ostream::operator<<(pvVar3,std::uppercase);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'X':
      pvVar3 = (void *)std::ostream::operator<<(local_1a0,std::hex);
      std::ostream::operator<<(pvVar3,std::uppercase);
      WriteUnsignedInt<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'a':
      std::ostream::operator<<(local_1a0,std::hexfloat);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'b':
      std::ostream::operator<<(local_1a0,std::boolalpha);
      Write<bool,int>((ostream *)local_1a0,arg);
      break;
    case 'c':
      Write<char,int>((ostream *)local_1a0,arg);
      break;
    case 'd':
    case 'i':
      std::ostream::operator<<(local_1a0,std::dec);
      WriteInt<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'e':
      std::ostream::operator<<(local_1a0,std::scientific);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'f':
      std::ostream::operator<<(local_1a0,std::fixed);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'g':
      std::ostream::operator<<(local_1a0,std::defaultfloat);
      WriteFloat<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'o':
      std::ostream::operator<<(local_1a0,std::oct);
      WriteUnsignedInt<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 's':
      WriteAnyString((ostream *)local_1a0,(ulong)(uint)*arg);
      break;
    case 'u':
      std::ostream::operator<<(local_1a0,std::dec);
      WriteUnsignedInt<int>((ostringstream *)local_1a0,arg,local_1a1);
      break;
    case 'x':
      std::ostream::operator<<(local_1a0,std::hex);
      WriteUnsignedInt<int>((ostringstream *)local_1a0,arg,local_1a1);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)result,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void AddArg(std::string& result, std::string::const_iterator& it, const std::string::const_iterator& itend, const Value& arg)
{
	std::ostringstream str;
	try
	{
		char mod = 0;
		mod = Parse(str, it, itend);
		if (it != itend)
		{
			char type = *it++;
			switch (type)
			{
			case 'd':
			case 'i':
				str << std::dec;
				WriteInt(str, arg, mod);
				break;
			case 'u':
				str << std::dec;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'o':
				str << std::oct;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'x':
				str << std::hex;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'X':
				str << std::hex << std::uppercase;
				WriteUnsignedInt(str, arg, mod);
				break;
			case 'f':
				str << std::fixed;
				WriteFloat(str, arg, mod);
				break;
			case 'e':
				str << std::scientific;
				WriteFloat(str, arg, mod);
				break;
			case 'E':
				str << std::scientific << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'g':
				str << std::defaultfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'G':
				str << std::defaultfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 'a':
				str << std::hexfloat;
				WriteFloat(str, arg, mod);
				break;
			case 'A':
				str << std::hexfloat << std::uppercase;
				WriteFloat(str, arg, mod);
				break;
			case 's':
				WriteAnyString(str, arg);
				break;
			case 'c':
				Write<char>(str, arg);
				break;
			case 'b':
				str << std::boolalpha;
				Write<bool>(str, arg);
				break;
			default:
				str << type;
			}
		}
	}
	catch (const std::exception&)
	{
		str << "!TYPE_MISMATCH!";
	}
	result += str.str();
}